

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_together.c
# Opt level: O0

void runtests(int n_workers)

{
  uint local_10;
  int i;
  int n_workers_local;
  
  lace_start(n_workers,0);
  printf("Newframe:\n");
  test_something_NEWFRAME();
  printf("Together:\n");
  test_something_TOGETHER();
  lace_suspend();
  lace_resume();
  printf("Running (10x):\n");
  for (local_10 = 0; (int)local_10 < 5; local_10 = local_10 + 1) {
    printf("%d: ",(ulong)local_10);
    test_something_RUN();
  }
  printf("Recursive test\n");
  _main_RUN((void *)0x0);
  lace_stop();
  return;
}

Assistant:

void
runtests(int n_workers)
{
    // Initialize the Lace framework for <n_workers> workers.
    lace_start(n_workers, 0);

    printf("Newframe:\n");
    NEWFRAME(test_something);

    printf("Together:\n");
    TOGETHER(test_something);

    lace_suspend();
    lace_resume();

    // Spawn and start all worker pthreads; suspends current thread until done.
    printf("Running (10x):\n");
    for (int i=0; i<5; i++) {
        printf("%d: ", i);
        RUN(test_something);
    }

    // Spawn and start all worker pthreads; suspends current thread until done.
    printf("Recursive test\n");
    RUN(_main, NULL);

    // The lace_startup command also exits Lace after _main is completed.
    lace_stop();
}